

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O1

QVariant * convertToInt(QVariant *__return_storage_ptr__,QString *str)

{
  longlong lVar1;
  char *__nptr;
  char *end;
  QArrayData *local_38;
  char *local_30;
  char *local_20;
  
  QString::toLocal8Bit_helper((QChar *)&local_38,(longlong)(str->d).ptr);
  __nptr = local_30;
  if (local_30 == (char *)0x0) {
    __nptr = (char *)&QByteArray::_empty;
  }
  lVar1 = strtoll(__nptr,&local_20,10);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,1,8);
    }
  }
  if (*local_20 == '\0') {
    QVariant::QVariant(__return_storage_ptr__,lVar1);
  }
  else {
    QString::toLocal8Bit_helper((QChar *)&local_38,(longlong)(str->d).ptr);
    if (local_30 == (char *)0x0) {
      local_30 = (char *)&QByteArray::_empty;
    }
    QVariant::QVariant(__return_storage_ptr__,local_30);
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38,1,8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline QVariant convertToInt(const QString &str) {
    char *end;
    auto i = strtoll(str.toLocal8Bit().constData(), &end, 10); // check if value can be converted to integer

    if (*end == '\0')  {
        return i;
    } else {
        return str.toLocal8Bit().constData();
    }
}